

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O3

void __thiscall SQASTWritingVisitor::visitFunctionDecl(SQASTWritingVisitor *this,FunctionDecl *f)

{
  OutputStream *pOVar1;
  ParamDecl **ppPVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  writeNodeHeader(this,(Node *)f);
  writeString(this,f->_name);
  pOVar1 = this->stream;
  uVar4 = (ulong)(f->_parameters)._size;
  uVar5 = uVar4;
  if (0x7f < uVar4) {
    do {
      (**pOVar1->_vptr_OutputStream)(pOVar1,(ulong)(byte)((byte)uVar4 | 0x80));
      uVar5 = uVar4 >> 7;
      bVar3 = 0x3fff < uVar4;
      uVar4 = uVar5;
    } while (bVar3);
  }
  (**pOVar1->_vptr_OutputStream)(pOVar1,uVar5 & 0xff);
  uVar4 = (ulong)(f->_parameters)._size;
  if (uVar4 != 0) {
    ppPVar2 = (f->_parameters)._vals;
    lVar6 = 0;
    do {
      SQCompilation::Node::visit<SQASTWritingVisitor>(*(Node **)((long)ppPVar2 + lVar6),this);
      lVar6 = lVar6 + 8;
    } while (uVar4 << 3 != lVar6);
  }
  SQCompilation::Node::visit<SQASTWritingVisitor>((Node *)f->_body,this);
  (**this->stream->_vptr_OutputStream)(this->stream,(ulong)f->_vararg);
  (**this->stream->_vptr_OutputStream)(this->stream,(ulong)f->_lambda);
  writeString(this,f->_sourcename);
  return;
}

Assistant:

void SQASTWritingVisitor::visitFunctionDecl(FunctionDecl *f) {
  writeNodeHeader(f);

  writeString(f->name());

  stream->writeUInt64(f->parameters().size());

  for (auto &p : f->parameters()) {
    p->visit(this);
  }

  f->body()->visit(this);
  stream->writeInt8(f->isVararg());
  stream->writeInt8(f->isLambda());

  writeString(f->sourceName());
}